

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4s.c
# Opt level: O0

int readChecksum(roslz4_stream *str)

{
  uint32_t uVar1;
  uint uVar2;
  roslz4_stream *in_RDI;
  uint32_t checksum;
  stream_state *state;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint32_t *dest_val;
  int local_4;
  
  dest_val = (uint32_t *)in_RDI->state;
  fillUInt32(in_RDI,dest_val,(int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (dest_val[0x14] == 4) {
    dest_val[8] = 1;
    uVar1 = readUInt32((uchar *)(dest_val + 0x13));
    dest_val[0x13] = uVar1;
    uVar2 = XXH32_digest(in_stack_ffffffffffffffd8);
    dest_val[10] = 0;
    dest_val[0xb] = 0;
    if (uVar2 == dest_val[0x13]) {
      local_4 = 2;
    }
    else {
      local_4 = -3;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int readChecksum(roslz4_stream *str) {
  stream_state *state = str->state;
  fillUInt32(str, &state->stream_checksum, &state->stream_checksum_read);
  if (state->stream_checksum_read == 4) {
    state->finished = 1;
    state->stream_checksum = readUInt32((unsigned char*)&state->stream_checksum);
    uint32_t checksum = XXH32_digest(state->xxh32_state);
    state->xxh32_state = NULL;
    if (checksum == state->stream_checksum) {
      return ROSLZ4_STREAM_END;
    } else {
      return ROSLZ4_DATA_ERROR;
    }
  }
  return ROSLZ4_OK;
}